

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TransformFeedback::DrawXFB::useGeometrySet(DrawXFB *this,GLuint program_id,bool invert_sign)

{
  int iVar1;
  undefined4 uVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  undefined4 uVar5;
  long lVar4;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  uVar2 = (**(code **)(lVar4 + 0xb48))(program_id,"invert_sign");
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetUniformLocation call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x11ba);
  if ((int)CONCAT71(in_register_00000011,invert_sign) == 0) {
    uVar5 = 0x3f800000;
  }
  else {
    uVar5 = 0xbf800000;
  }
  (**(code **)(lVar4 + 0x14e0))(uVar5,uVar2);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glUniform4f call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x11bd);
  return;
}

Assistant:

void gl3cts::TransformFeedback::DrawXFB::useGeometrySet(glw::GLuint program_id, bool invert_sign)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint location = gl.getUniformLocation(program_id, "invert_sign");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation call failed.");

	gl.uniform1f(location, invert_sign ? -1.f : 1.f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4f call failed.");
}